

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O3

void anon_unknown.dwarf_4ec2e9::TestLShift1(BIGNUMFileTest *t,BN_CTX *ctx)

{
  int iVar1;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  char *pcVar2;
  pointer message;
  char *in_R9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var3;
  _Head_base<0UL,_bignum_st_*,_false> expected_predicate_value;
  UniquePtr<BIGNUM> ret;
  UniquePtr<BIGNUM> two;
  UniquePtr<BIGNUM> lshift1;
  UniquePtr<BIGNUM> a;
  UniquePtr<BIGNUM> remainder;
  UniquePtr<BIGNUM> zero;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_80;
  Message local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  AssertHelper local_68;
  undefined1 local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  _Head_base<0UL,_bignum_st_*,_false> local_38;
  undefined1 local_30 [8];
  undefined1 local_28 [8];
  _Head_base<0UL,_bignum_st_*,_false> local_20;
  _Head_base<0UL,_bignum_st_*,_false> local_18;
  
  BIGNUMFileTest::GetBIGNUMImpl((BIGNUMFileTest *)local_28,(char *)t,true);
  BIGNUMFileTest::GetBIGNUMImpl((BIGNUMFileTest *)local_30,(char *)t,true);
  local_18._M_head_impl = (bignum_st *)BN_new();
  local_78.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = (internal)(local_28 != (undefined1  [8])0x0);
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28 == (undefined1  [8])0x0) {
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_60,(internal *)&local_78,
               (AssertionResult *)(anon_var_dwarf_1aa588 + 0xc),"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0xfc,(char *)CONCAT71(local_60._1_7_,local_60[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_40);
  }
  else {
    local_78.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = (internal)(local_30 != (undefined1  [8])0x0);
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_30 == (undefined1  [8])0x0) {
      testing::Message::Message((Message *)&local_40);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_60,(internal *)&local_78,(AssertionResult *)"lshift1","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0xfd,(char *)CONCAT71(local_60._1_7_,local_60[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_40);
    }
    else {
      local_78.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ = (internal)((BIGNUM *)local_18._M_head_impl != (BIGNUM *)0x0);
      local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((bool)local_78.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._0_1_) {
        BN_zero(local_18._M_head_impl);
        local_40._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)BN_new();
        local_38._M_head_impl = (bignum_st *)BN_new();
        local_20._M_head_impl = (bignum_st *)BN_new();
        local_78.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_1_ = (internal)((BIGNUM *)local_40._M_head_impl != (BIGNUM *)0x0);
        local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((BIGNUM *)local_40._M_head_impl == (BIGNUM *)0x0) {
          testing::Message::Message((Message *)&local_80);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_60,(internal *)&local_78,(AssertionResult *)0x54c35d,"false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x103,(char *)CONCAT71(local_60._1_7_,local_60[0]));
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_80);
LAB_0029d6db:
          this = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70;
          testing::internal::AssertHelper::~AssertHelper(&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_60._1_7_,local_60[0]),
                            local_50._M_allocated_capacity + 1);
          }
          if (local_80._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_80._M_head_impl + 8))();
          }
          local_58 = local_70;
          if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
LAB_0029d71d:
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()(this,local_58);
          }
        }
        else {
          local_78.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_1_ = (internal)((BIGNUM *)local_38._M_head_impl != (BIGNUM *)0x0);
          local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if ((BIGNUM *)local_38._M_head_impl == (BIGNUM *)0x0) {
            testing::Message::Message((Message *)&local_80);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_60,(internal *)&local_78,(AssertionResult *)0x53d160,"false",
                       "true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_68,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x104,(char *)CONCAT71(local_60._1_7_,local_60[0]));
            testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_80);
            goto LAB_0029d6db;
          }
          local_78.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_1_ = (internal)((BIGNUM *)local_20._M_head_impl != (BIGNUM *)0x0);
          local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if ((BIGNUM *)local_20._M_head_impl == (BIGNUM *)0x0) {
            testing::Message::Message((Message *)&local_80);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_60,(internal *)&local_78,(AssertionResult *)"remainder",
                       "false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_68,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x105,(char *)CONCAT71(local_60._1_7_,local_60[0]));
            testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_80);
            goto LAB_0029d6db;
          }
          iVar1 = BN_set_word((BIGNUM *)local_38._M_head_impl,2);
          local_78.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_1_ = (internal)(iVar1 != 0);
          local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)&local_80);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_60,(internal *)&local_78,
                       (AssertionResult *)"BN_set_word(two.get(), 2)","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_68,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x107,(char *)CONCAT71(local_60._1_7_,local_60[0]));
            testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_80);
            goto LAB_0029d6db;
          }
          iVar1 = BN_add((BIGNUM *)local_40._M_head_impl,(BIGNUM *)local_28,(BIGNUM *)local_28);
          local_78.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_1_ = (internal)(iVar1 != 0);
          local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)&local_80);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_60,(internal *)&local_78,
                       (AssertionResult *)"BN_add(ret.get(), a.get(), a.get())","false","true",in_R9
                      );
            testing::internal::AssertHelper::AssertHelper
                      (&local_68,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x108,(char *)CONCAT71(local_60._1_7_,local_60[0]));
            testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_80);
            goto LAB_0029d6db;
          }
          _Var3._M_head_impl = local_40._M_head_impl;
          AssertBIGNUMSEqual(local_60,"lshift1.get()","ret.get()","A + A",(BIGNUM *)local_30,
                             (BIGNUM *)local_40._M_head_impl);
          if (local_60[0] == '\0') {
            testing::Message::Message(&local_78);
            if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar2 = "";
            }
            else {
              pcVar2 = (local_58->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_80,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x109,pcVar2);
            testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,&local_78);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
            if ((long *)CONCAT71(local_78.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._1_7_,
                                 local_78.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._0_1_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(local_78.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._1_7_,
                                             local_78.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._0_1_) + 8))();
            }
          }
          if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_58,local_58);
          }
          iVar1 = BN_mul((BIGNUM *)local_40._M_head_impl,(BIGNUM *)local_28,
                         (BIGNUM *)local_38._M_head_impl,(BN_CTX *)ctx);
          local_78.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_1_ = (internal)(iVar1 != 0);
          local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)&local_80);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_60,(internal *)&local_78,
                       (AssertionResult *)"BN_mul(ret.get(), a.get(), two.get(), ctx)","false",
                       "true",(char *)_Var3._M_head_impl);
            testing::internal::AssertHelper::AssertHelper
                      (&local_68,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x10b,(char *)CONCAT71(local_60._1_7_,local_60[0]));
            testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_80);
            goto LAB_0029d6db;
          }
          _Var3._M_head_impl = local_40._M_head_impl;
          AssertBIGNUMSEqual(local_60,"lshift1.get()","ret.get()","A * 2",(BIGNUM *)local_30,
                             (BIGNUM *)local_40._M_head_impl);
          if (local_60[0] == '\0') {
            testing::Message::Message(&local_78);
            if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar2 = "";
            }
            else {
              pcVar2 = (local_58->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_80,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x10c,pcVar2);
            testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,&local_78);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
            if ((long *)CONCAT71(local_78.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._1_7_,
                                 local_78.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._0_1_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(local_78.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._1_7_,
                                             local_78.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._0_1_) + 8))();
            }
          }
          if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_58,local_58);
          }
          iVar1 = BN_div((BIGNUM *)local_40._M_head_impl,(BIGNUM *)local_20._M_head_impl,
                         (BIGNUM *)local_30,(BIGNUM *)local_38._M_head_impl,(BN_CTX *)ctx);
          local_78.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_1_ = (internal)(iVar1 != 0);
          local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)&local_80);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_60,(internal *)&local_78,
                       (AssertionResult *)
                       "BN_div(ret.get(), remainder.get(), lshift1.get(), two.get(), ctx)","false",
                       "true",(char *)_Var3._M_head_impl);
            testing::internal::AssertHelper::AssertHelper
                      (&local_68,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x10f,(char *)CONCAT71(local_60._1_7_,local_60[0]));
            testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_80);
            goto LAB_0029d6db;
          }
          AssertBIGNUMSEqual(local_60,"a.get()","ret.get()","LShift1 / 2",(BIGNUM *)local_28,
                             (BIGNUM *)local_40._M_head_impl);
          if (local_60[0] == '\0') {
            testing::Message::Message(&local_78);
            if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar2 = "";
            }
            else {
              pcVar2 = (local_58->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_80,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x110,pcVar2);
            testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,&local_78);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
            if ((long *)CONCAT71(local_78.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._1_7_,
                                 local_78.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._0_1_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(local_78.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._1_7_,
                                             local_78.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._0_1_) + 8))();
            }
          }
          if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_58,local_58);
          }
          expected_predicate_value._M_head_impl = local_20._M_head_impl;
          AssertBIGNUMSEqual(local_60,"zero.get()","remainder.get()","LShift1 % 2",
                             local_18._M_head_impl,local_20._M_head_impl);
          if (local_60[0] == '\0') {
            testing::Message::Message(&local_78);
            if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar2 = "";
            }
            else {
              pcVar2 = (local_58->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_80,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x111,pcVar2);
            testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,&local_78);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
            if ((long *)CONCAT71(local_78.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._1_7_,
                                 local_78.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._0_1_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(local_78.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._1_7_,
                                             local_78.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._0_1_) + 8))();
            }
          }
          if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_58,local_58);
          }
          iVar1 = BN_lshift1((BIGNUM *)local_40._M_head_impl,(BIGNUM *)local_28);
          local_78.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_1_ = (internal)(iVar1 != 0);
          local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)&local_80);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_60,(internal *)&local_78,
                       (AssertionResult *)"BN_lshift1(ret.get(), a.get())","false","true",
                       (char *)expected_predicate_value._M_head_impl);
            testing::internal::AssertHelper::AssertHelper
                      (&local_68,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x113,(char *)CONCAT71(local_60._1_7_,local_60[0]));
            testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_80);
            goto LAB_0029d6db;
          }
          _Var3._M_head_impl = local_40._M_head_impl;
          AssertBIGNUMSEqual(local_60,"lshift1.get()","ret.get()","A << 1",(BIGNUM *)local_30,
                             (BIGNUM *)local_40._M_head_impl);
          if (local_60[0] == '\0') {
            testing::Message::Message(&local_78);
            if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar2 = "";
            }
            else {
              pcVar2 = (local_58->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_80,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x114,pcVar2);
            testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,&local_78);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
            if ((long *)CONCAT71(local_78.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._1_7_,
                                 local_78.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._0_1_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(local_78.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._1_7_,
                                             local_78.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._0_1_) + 8))();
            }
          }
          if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_58,local_58);
          }
          iVar1 = BN_lshift((BIGNUM *)local_40._M_head_impl,(BIGNUM *)local_28,1);
          local_78.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_1_ = (internal)(iVar1 != 0);
          local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)&local_80);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_60,(internal *)&local_78,
                       (AssertionResult *)"BN_lshift(ret.get(), a.get(), 1)","false","true",
                       (char *)_Var3._M_head_impl);
            testing::internal::AssertHelper::AssertHelper
                      (&local_68,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x116,(char *)CONCAT71(local_60._1_7_,local_60[0]));
            testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_80);
            goto LAB_0029d6db;
          }
          _Var3._M_head_impl = local_40._M_head_impl;
          AssertBIGNUMSEqual(local_60,"lshift1.get()","ret.get()","A << 1 (variable shift)",
                             (BIGNUM *)local_30,(BIGNUM *)local_40._M_head_impl);
          if (local_60[0] == '\0') {
            testing::Message::Message(&local_78);
            if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar2 = "";
            }
            else {
              pcVar2 = (local_58->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_80,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x117,pcVar2);
            testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,&local_78);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
            if ((long *)CONCAT71(local_78.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._1_7_,
                                 local_78.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._0_1_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(local_78.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._1_7_,
                                             local_78.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._0_1_) + 8))();
            }
          }
          if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_58,local_58);
          }
          iVar1 = BN_rshift1((BIGNUM *)local_40._M_head_impl,(BIGNUM *)local_30);
          local_78.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_1_ = (internal)(iVar1 != 0);
          local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)&local_80);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_60,(internal *)&local_78,
                       (AssertionResult *)"BN_rshift1(ret.get(), lshift1.get())","false","true",
                       (char *)_Var3._M_head_impl);
            testing::internal::AssertHelper::AssertHelper
                      (&local_68,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x119,(char *)CONCAT71(local_60._1_7_,local_60[0]));
            testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_80);
            goto LAB_0029d6db;
          }
          _Var3._M_head_impl = local_40._M_head_impl;
          AssertBIGNUMSEqual(local_60,"a.get()","ret.get()","LShift >> 1",(BIGNUM *)local_28,
                             (BIGNUM *)local_40._M_head_impl);
          if (local_60[0] == '\0') {
            testing::Message::Message(&local_78);
            if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar2 = "";
            }
            else {
              pcVar2 = (local_58->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_80,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x11a,pcVar2);
            testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,&local_78);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
            if ((long *)CONCAT71(local_78.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._1_7_,
                                 local_78.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._0_1_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(local_78.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._1_7_,
                                             local_78.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._0_1_) + 8))();
            }
          }
          if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_58,local_58);
          }
          iVar1 = BN_rshift((BIGNUM *)local_40._M_head_impl,(BIGNUM *)local_30,1);
          local_78.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_1_ = (internal)(iVar1 != 0);
          local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)&local_80);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_60,(internal *)&local_78,
                       (AssertionResult *)"BN_rshift(ret.get(), lshift1.get(), 1)","false","true",
                       (char *)_Var3._M_head_impl);
            testing::internal::AssertHelper::AssertHelper
                      (&local_68,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x11c,(char *)CONCAT71(local_60._1_7_,local_60[0]));
            testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_80);
            goto LAB_0029d6db;
          }
          _Var3._M_head_impl = local_40._M_head_impl;
          AssertBIGNUMSEqual(local_60,"a.get()","ret.get()","LShift >> 1 (variable shift)",
                             (BIGNUM *)local_28,(BIGNUM *)local_40._M_head_impl);
          if (local_60[0] == '\0') {
            testing::Message::Message(&local_78);
            if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar2 = "";
            }
            else {
              pcVar2 = (local_58->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_80,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x11d,pcVar2);
            testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,&local_78);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
            if ((long *)CONCAT71(local_78.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._1_7_,
                                 local_78.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._0_1_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(local_78.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._1_7_,
                                             local_78.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._0_1_) + 8))();
            }
          }
          if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_58,local_58);
          }
          iVar1 = bn_rshift_secret_shift((BIGNUM *)local_40._M_head_impl,(BIGNUM *)local_30,1,ctx);
          local_78.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_1_ = (internal)(iVar1 != 0);
          local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)&local_80);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_60,(internal *)&local_78,
                       (AssertionResult *)"bn_rshift_secret_shift(ret.get(), lshift1.get(), 1, ctx)"
                       ,"false","true",(char *)_Var3._M_head_impl);
            testing::internal::AssertHelper::AssertHelper
                      (&local_68,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x11f,(char *)CONCAT71(local_60._1_7_,local_60[0]));
            testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_80);
            goto LAB_0029d6db;
          }
          _Var3._M_head_impl = local_40._M_head_impl;
          AssertBIGNUMSEqual(local_60,"a.get()","ret.get()","LShift >> 1 (secret shift)",
                             (BIGNUM *)local_28,(BIGNUM *)local_40._M_head_impl);
          if (local_60[0] == '\0') {
            testing::Message::Message(&local_78);
            if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar2 = "";
            }
            else {
              pcVar2 = (local_58->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_80,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x120,pcVar2);
            testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,&local_78);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
            if ((long *)CONCAT71(local_78.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._1_7_,
                                 local_78.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._0_1_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(local_78.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._1_7_,
                                             local_78.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._0_1_) + 8))();
            }
          }
          if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_58,local_58);
          }
          iVar1 = BN_set_bit((BIGNUM *)local_30,0);
          local_78.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_1_ = (internal)(iVar1 != 0);
          local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)&local_80);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_60,(internal *)&local_78,
                       (AssertionResult *)"BN_set_bit(lshift1.get(), 0)","false","true",
                       (char *)_Var3._M_head_impl);
            testing::internal::AssertHelper::AssertHelper
                      (&local_68,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x123,(char *)CONCAT71(local_60._1_7_,local_60[0]));
            testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_80);
            goto LAB_0029d6db;
          }
          iVar1 = BN_div((BIGNUM *)local_40._M_head_impl,(BIGNUM *)0x0,(BIGNUM *)local_30,
                         (BIGNUM *)local_38._M_head_impl,(BN_CTX *)ctx);
          local_78.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_1_ = (internal)(iVar1 != 0);
          local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)&local_80);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_60,(internal *)&local_78,
                       (AssertionResult *)
                       "BN_div(ret.get(), nullptr , lshift1.get(), two.get(), ctx)","false","true",
                       (char *)_Var3._M_head_impl);
            testing::internal::AssertHelper::AssertHelper
                      (&local_68,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x125,(char *)CONCAT71(local_60._1_7_,local_60[0]));
            testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_80);
            goto LAB_0029d6db;
          }
          _Var3._M_head_impl = local_40._M_head_impl;
          AssertBIGNUMSEqual(local_60,"a.get()","ret.get()","(LShift1 | 1) / 2",(BIGNUM *)local_28,
                             (BIGNUM *)local_40._M_head_impl);
          if (local_60[0] == '\0') {
            testing::Message::Message(&local_78);
            if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar2 = "";
            }
            else {
              pcVar2 = (local_58->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_80,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x126,pcVar2);
            testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,&local_78);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
            if ((long *)CONCAT71(local_78.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._1_7_,
                                 local_78.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._0_1_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(local_78.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._1_7_,
                                             local_78.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._0_1_) + 8))();
            }
          }
          if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_58,local_58);
          }
          iVar1 = BN_rshift1((BIGNUM *)local_40._M_head_impl,(BIGNUM *)local_30);
          local_78.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_1_ = (internal)(iVar1 != 0);
          local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)&local_80);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_60,(internal *)&local_78,
                       (AssertionResult *)"BN_rshift1(ret.get(), lshift1.get())","false","true",
                       (char *)_Var3._M_head_impl);
            testing::internal::AssertHelper::AssertHelper
                      (&local_68,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x128,(char *)CONCAT71(local_60._1_7_,local_60[0]));
            testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_80);
            goto LAB_0029d6db;
          }
          _Var3._M_head_impl = local_40._M_head_impl;
          AssertBIGNUMSEqual(local_60,"a.get()","ret.get()","(LShift | 1) >> 1",(BIGNUM *)local_28,
                             (BIGNUM *)local_40._M_head_impl);
          if (local_60[0] == '\0') {
            testing::Message::Message(&local_78);
            if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar2 = "";
            }
            else {
              pcVar2 = (local_58->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_80,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x129,pcVar2);
            testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,&local_78);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
            if ((long *)CONCAT71(local_78.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._1_7_,
                                 local_78.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._0_1_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(local_78.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._1_7_,
                                             local_78.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._0_1_) + 8))();
            }
          }
          if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_58,local_58);
          }
          iVar1 = BN_rshift((BIGNUM *)local_40._M_head_impl,(BIGNUM *)local_30,1);
          local_78.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_1_ = (internal)(iVar1 != 0);
          local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)&local_80);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_60,(internal *)&local_78,
                       (AssertionResult *)"BN_rshift(ret.get(), lshift1.get(), 1)","false","true",
                       (char *)_Var3._M_head_impl);
            testing::internal::AssertHelper::AssertHelper
                      (&local_68,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,299,(char *)CONCAT71(local_60._1_7_,local_60[0]));
            testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_80);
            goto LAB_0029d6db;
          }
          _Var3._M_head_impl = local_40._M_head_impl;
          AssertBIGNUMSEqual(local_60,"a.get()","ret.get()","(LShift | 1) >> 1 (variable shift)",
                             (BIGNUM *)local_28,(BIGNUM *)local_40._M_head_impl);
          if (local_60[0] == '\0') {
            testing::Message::Message(&local_78);
            if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar2 = "";
            }
            else {
              pcVar2 = (local_58->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_80,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x12d,pcVar2);
            testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,&local_78);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
            if ((long *)CONCAT71(local_78.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._1_7_,
                                 local_78.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._0_1_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(local_78.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._1_7_,
                                             local_78.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._0_1_) + 8))();
            }
          }
          if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_58,local_58);
          }
          iVar1 = bn_rshift_secret_shift((BIGNUM *)local_40._M_head_impl,(BIGNUM *)local_30,1,ctx);
          local_78.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_1_ = (internal)(iVar1 != 0);
          local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)&local_80);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_60,(internal *)&local_78,
                       (AssertionResult *)"bn_rshift_secret_shift(ret.get(), lshift1.get(), 1, ctx)"
                       ,"false","true",(char *)_Var3._M_head_impl);
            testing::internal::AssertHelper::AssertHelper
                      (&local_68,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x12f,(char *)CONCAT71(local_60._1_7_,local_60[0]));
            testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_80);
            goto LAB_0029d6db;
          }
          AssertBIGNUMSEqual(local_60,"a.get()","ret.get()","(LShift | 1) >> 1 (secret shift)",
                             (BIGNUM *)local_28,(BIGNUM *)local_40._M_head_impl);
          if (local_60[0] == '\0') {
            testing::Message::Message(&local_78);
            if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              message = "";
            }
            else {
              message = (local_58->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_80,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x130,message);
            testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,&local_78);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
            if ((long *)CONCAT71(local_78.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._1_7_,
                                 local_78.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._0_1_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(local_78.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._1_7_,
                                             local_78.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._0_1_) + 8))();
            }
          }
          if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            this = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_58;
            goto LAB_0029d71d;
          }
        }
        std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_20);
        std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_38);
        std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_40);
        goto LAB_0029d740;
      }
      testing::Message::Message((Message *)&local_40);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_60,(internal *)&local_78,(AssertionResult *)0x5120f6,"false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0xfe,(char *)CONCAT71(local_60._1_7_,local_60[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_40);
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
  }
  if ((BIGNUM *)local_40._M_head_impl != (BIGNUM *)0x0) {
    (**(code **)(*(long *)local_40._M_head_impl + 8))();
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
LAB_0029d740:
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_18);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)local_30);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)local_28);
  return;
}

Assistant:

static void TestLShift1(BIGNUMFileTest *t, BN_CTX *ctx) {
  bssl::UniquePtr<BIGNUM> a = t->GetBIGNUM("A");
  bssl::UniquePtr<BIGNUM> lshift1 = t->GetBIGNUM("LShift1");
  bssl::UniquePtr<BIGNUM> zero(BN_new());
  ASSERT_TRUE(a);
  ASSERT_TRUE(lshift1);
  ASSERT_TRUE(zero);

  BN_zero(zero.get());

  bssl::UniquePtr<BIGNUM> ret(BN_new()), two(BN_new()), remainder(BN_new());
  ASSERT_TRUE(ret);
  ASSERT_TRUE(two);
  ASSERT_TRUE(remainder);

  ASSERT_TRUE(BN_set_word(two.get(), 2));
  ASSERT_TRUE(BN_add(ret.get(), a.get(), a.get()));
  EXPECT_BIGNUMS_EQUAL("A + A", lshift1.get(), ret.get());

  ASSERT_TRUE(BN_mul(ret.get(), a.get(), two.get(), ctx));
  EXPECT_BIGNUMS_EQUAL("A * 2", lshift1.get(), ret.get());

  ASSERT_TRUE(
      BN_div(ret.get(), remainder.get(), lshift1.get(), two.get(), ctx));
  EXPECT_BIGNUMS_EQUAL("LShift1 / 2", a.get(), ret.get());
  EXPECT_BIGNUMS_EQUAL("LShift1 % 2", zero.get(), remainder.get());

  ASSERT_TRUE(BN_lshift1(ret.get(), a.get()));
  EXPECT_BIGNUMS_EQUAL("A << 1", lshift1.get(), ret.get());

  ASSERT_TRUE(BN_lshift(ret.get(), a.get(), 1));
  EXPECT_BIGNUMS_EQUAL("A << 1 (variable shift)", lshift1.get(), ret.get());

  ASSERT_TRUE(BN_rshift1(ret.get(), lshift1.get()));
  EXPECT_BIGNUMS_EQUAL("LShift >> 1", a.get(), ret.get());

  ASSERT_TRUE(BN_rshift(ret.get(), lshift1.get(), 1));
  EXPECT_BIGNUMS_EQUAL("LShift >> 1 (variable shift)", a.get(), ret.get());

  ASSERT_TRUE(bn_rshift_secret_shift(ret.get(), lshift1.get(), 1, ctx));
  EXPECT_BIGNUMS_EQUAL("LShift >> 1 (secret shift)", a.get(), ret.get());

  // Set the LSB to 1 and test rshift1 again.
  ASSERT_TRUE(BN_set_bit(lshift1.get(), 0));
  ASSERT_TRUE(
      BN_div(ret.get(), nullptr /* rem */, lshift1.get(), two.get(), ctx));
  EXPECT_BIGNUMS_EQUAL("(LShift1 | 1) / 2", a.get(), ret.get());

  ASSERT_TRUE(BN_rshift1(ret.get(), lshift1.get()));
  EXPECT_BIGNUMS_EQUAL("(LShift | 1) >> 1", a.get(), ret.get());

  ASSERT_TRUE(BN_rshift(ret.get(), lshift1.get(), 1));
  EXPECT_BIGNUMS_EQUAL("(LShift | 1) >> 1 (variable shift)", a.get(),
                       ret.get());

  ASSERT_TRUE(bn_rshift_secret_shift(ret.get(), lshift1.get(), 1, ctx));
  EXPECT_BIGNUMS_EQUAL("(LShift | 1) >> 1 (secret shift)", a.get(), ret.get());
}